

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# emu2413.c
# Opt level: O0

void makeTllTable(void)

{
  int iVar1;
  int local_1c;
  int local_18;
  int32_t KL;
  int32_t TL;
  int32_t block;
  int32_t fnum;
  int32_t tmp;
  
  for (TL = 0; TL < 0x10; TL = TL + 1) {
    for (KL = 0; KL < 8; KL = KL + 1) {
      for (local_18 = 0; local_18 < 0x40; local_18 = local_18 + 1) {
        for (local_1c = 0; local_1c < 4; local_1c = local_1c + 1) {
          if (local_1c == 0) {
            tllTable[TL][KL][local_18][0] = local_18 << 1;
          }
          else {
            iVar1 = (int)((double)(7 - KL) * -6.0 + makeTllTable::kltable[TL]);
            if (iVar1 < 1) {
              tllTable[TL][KL][local_18][local_1c] = local_18 << 1;
            }
            else {
              tllTable[TL][KL][local_18][local_1c] =
                   (int)(long)((double)(iVar1 >> (3U - (char)local_1c & 0x1f)) / 0.375) +
                   local_18 * 2;
            }
          }
        }
      }
    }
  }
  return;
}

Assistant:

static void
makeTllTable (void)
{
#define dB2(x) ((x)*2)

  static double kltable[16] = {
    dB2 (0.000), dB2 (9.000), dB2 (12.000), dB2 (13.875), dB2 (15.000), dB2 (16.125), dB2 (16.875), dB2 (17.625),
    dB2 (18.000), dB2 (18.750), dB2 (19.125), dB2 (19.500), dB2 (19.875), dB2 (20.250), dB2 (20.625), dB2 (21.000)
  };

  int32_t tmp;
  int32_t fnum, block, TL, KL;

  for (fnum = 0; fnum < 16; fnum++)
    for (block = 0; block < 8; block++)
      for (TL = 0; TL < 64; TL++)
        for (KL = 0; KL < 4; KL++)
        {
          if (KL == 0)
          {
            tllTable[fnum][block][TL][KL] = TL2EG (TL);
          }
          else
          {
            tmp = (int32_t) (kltable[fnum] - dB2 (3.000) * (7 - block));
            if (tmp <= 0)
              tllTable[fnum][block][TL][KL] = TL2EG (TL);
            else
              tllTable[fnum][block][TL][KL] = (uint32_t) ((tmp >> (3 - KL)) / EG_STEP) + TL2EG (TL);
          }
        }
}